

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexSpacing.cpp
# Opt level: O2

_tess_edges * __thiscall
glcts::TessellationShaderVertexSpacing::getEdgesForIsolinesTessellation
          (_tess_edges *__return_storage_ptr__,TessellationShaderVertexSpacing *this,_run *run)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  pointer p_Var4;
  _tess_edge_points *edge_points;
  float fVar5;
  float fVar6;
  _tess_edge new_edge;
  value_type local_60;
  value_type local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = 0;
  do {
    if (run->n_vertices <= uVar3) {
      for (p_Var4 = (__return_storage_ptr__->
                    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          p_Var4 != (__return_storage_ptr__->
                    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
                    )._M_impl.super__Vector_impl_data._M_finish; p_Var4 = p_Var4 + 1) {
        std::
        __sort<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian)>>
                  ((p_Var4->points).
                   super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (p_Var4->points).
                   super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (_Iter_comp_iter<bool_(*)(glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian)>
                    )0xcb3b64);
      }
      return __return_storage_ptr__;
    }
    pcVar1 = (run->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = (ulong)(uint)((int)uVar3 * 3);
    local_60.y = *(float *)(pcVar1 + uVar2 * 4 + 4);
    local_60.x = *(float *)(pcVar1 + uVar2 * 4);
    for (p_Var4 = (__return_storage_ptr__->
                  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        p_Var4 != (__return_storage_ptr__->
                  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
                  )._M_impl.super__Vector_impl_data._M_finish; p_Var4 = p_Var4 + 1) {
      fVar5 = ((p_Var4->points).
               super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
               ._M_impl.super__Vector_impl_data._M_start)->y - local_60.y;
      fVar6 = -fVar5;
      if (-fVar5 <= fVar5) {
        fVar6 = fVar5;
      }
      if (fVar6 < 0.001) {
        std::
        vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
        ::push_back(&p_Var4->points,&local_60);
        if (p_Var4 != (__return_storage_ptr__->
                      super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
                      )._M_impl.super__Vector_impl_data._M_finish) goto LAB_00cb3cda;
        break;
      }
    }
    local_58.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.edge_length = 1.0;
    local_58.outermost_tess_level = run->outer[1];
    local_58.tess_level = local_58.outermost_tess_level;
    std::
    vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ::push_back(&local_58.points,&local_60);
    std::
    vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
    ::push_back(__return_storage_ptr__,&local_58);
    std::
    _Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ::~_Vector_base((_Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                     *)&local_58);
LAB_00cb3cda:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

TessellationShaderVertexSpacing::_tess_edges TessellationShaderVertexSpacing::getEdgesForIsolinesTessellation(
	const _run& run)
{
	_tess_edges result;

	/* First convert the array data to a vector of edges, where each edge
	 * is a vector of points with the same V component. After this is done,
	 * points for each edge need to be sorted by U component.
	 */
	for (unsigned int n_vertex = 0; n_vertex < run.n_vertices; ++n_vertex)
	{
		/* Isolines are simple - we only need to create a new edge per each unique height */
		const float*			   coordinate = (const float*)(&run.data[0]) + 3 /* components */ * n_vertex;
		_tess_coordinate_cartesian new_item;

		new_item.x = coordinate[0];
		new_item.y = coordinate[1];

		/* Is V recognized? */
		_tess_edges_iterator edges_iterator;

		for (edges_iterator = result.begin(); edges_iterator != result.end(); edges_iterator++)
		{
			_tess_edge& edge = *edges_iterator;

			/* Each edge uses the same Y component, so we only need to check the first entry */
			if (de::abs(edge.points[0].y - coordinate[1]) < epsilon)
			{
				/* Add the new point to the vector */
				edge.points.push_back(new_item);

				break;
			}
		} /* for (all edges) */

		if (edges_iterator == result.end())
		{
			/* New edge starts at this point.
			 *
			 * Note that outermost tessellation level does not apply to this
			 * primitive mode.
			 **/
			_tess_edge new_edge(run.outer[1], run.outer[1], 1.0f);

			new_edge.points.push_back(new_item);

			result.push_back(new_edge);
		}
	} /* for (all vertices) */

	/* For each edge, sort the points by U coordinate */
	for (_tess_edges_iterator edges_iterator = result.begin(); edges_iterator != result.end(); ++edges_iterator)
	{
		_tess_edge_points& edge_points = edges_iterator->points;

		std::sort(edge_points.begin(), edge_points.end(), compareEdgeByX);
	}

	/* Done */
	return result;
}